

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeWithPolicy
          (ThreadSafeArena *this,void *mem,size_t size,AllocationPolicy policy)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  SerialArena *pSVar6;
  void *owner;
  ulong uVar7;
  size_t *in_FS_OFFSET;
  Memory MVar8;
  Memory mem_00;
  LogFinisher local_e1;
  size_t *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  MVar8.size = size;
  MVar8.ptr = mem;
  uVar1 = *(ulong *)(this + 8);
  if ((((policy.start_block_size == 0x2000) && (policy.max_block_size == 0x2000)) &&
      (policy.block_alloc == (_func_void_ptr_size_t *)0x0)) &&
     ((policy.block_dealloc == (_func_void_void_ptr_size_t *)0x0 &&
      (policy.metrics_collector == (ArenaMetricsCollector *)0x0)))) {
    InitializeFrom(this,mem,size);
    if ((3 < uVar1) && (((uVar1 ^ *(ulong *)(this + 8)) & 3) != 0)) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0xf6);
      pLVar4 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: (old_alloc_policy & 3) == (alloc_policy_.get_raw() & 3): ")
      ;
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar4);
      LogMessage::~LogMessage(&local_a0);
    }
  }
  else {
    if (((ulong)mem & 7) != 0) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0xf9);
      pLVar4 = LogMessage::operator<<
                         (&local_a0,"CHECK failed: (reinterpret_cast<uintptr_t>(mem) & 7) == (0u): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar4);
      LogMessage::~LogMessage(&local_a0);
    }
    Init(this);
    if (policy.metrics_collector == (ArenaMetricsCollector *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (ulong)((uint)(byte)policy.metrics_collector[8] * 2);
    }
    uVar5 = *(ulong *)(this + 8) & 0xfffffffffffffffd | uVar7;
    *(ulong *)(this + 8) = uVar5;
    owner = (void *)CONCAT71((int7)(uVar7 >> 8),mem == (void *)0x0);
    if (size < 0x78 || mem == (void *)0x0) {
      MVar8 = AllocateMemory(&policy,0,0x78);
    }
    else {
      *(ulong *)(this + 8) = uVar5 | 1;
    }
    sVar2 = *in_FS_OFFSET;
    mem_00.size = sVar2;
    mem_00.ptr = (void *)MVar8.size;
    pSVar6 = SerialArena::New((SerialArena *)MVar8.ptr,mem_00,owner);
    pSVar6->next_ = (SerialArena *)0x0;
    *(SerialArena **)(this + 0x10) = pSVar6;
    *(SerialArena **)(sVar2 + 0x10) = pSVar6;
    *(undefined8 *)(sVar2 + 8) = *(undefined8 *)this;
    *(SerialArena **)(this + 0x18) = pSVar6;
    if ((*(SerialArena **)(this + 0x10) == (SerialArena *)0x0) ||
       (bVar3 = SerialArena::MaybeAllocateAligned(*(SerialArena **)(this + 0x10),0x28,&local_e0),
       !bVar3)) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0x115);
      pLVar4 = LogMessage::operator<<(&local_d8,"MaybeAllocateAligned cannot fail here.");
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar4);
      LogMessage::~LogMessage(&local_d8);
    }
    else {
      local_e0[4] = (size_t)policy.metrics_collector;
      local_e0[2] = (size_t)policy.block_alloc;
      local_e0[3] = (size_t)policy.block_dealloc;
      *local_e0 = policy.start_block_size;
      local_e0[1] = policy.max_block_size;
      if (((ulong)local_e0 & 3) != 0) {
        LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                   ,0x11a);
        pLVar4 = LogMessage::operator<<
                           (&local_d8,"CHECK failed: (0) == (reinterpret_cast<uintptr_t>(p) & 3): ")
        ;
        LogFinisher::operator=((LogFinisher *)&local_68,pLVar4);
        LogMessage::~LogMessage(&local_d8);
      }
      uVar7 = (ulong)((uint)*(undefined8 *)(this + 8) & 7) | (ulong)local_e0;
      *(ulong *)(this + 8) = uVar7;
      if ((3 < uVar1) && (((uVar7 ^ uVar1) & 3) != 0)) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                   ,0x11c);
        pLVar4 = LogMessage::operator<<
                           (&local_68,
                            "CHECK failed: (old_alloc_policy & 3) == (alloc_policy_.get_raw() & 3): "
                           );
        LogFinisher::operator=(&local_e1,pLVar4);
        LogMessage::~LogMessage(&local_68);
      }
    }
  }
  return;
}

Assistant:

void ThreadSafeArena::InitializeWithPolicy(void* mem, size_t size,
                                           AllocationPolicy policy) {
#ifndef NDEBUG
  const uint64_t old_alloc_policy = alloc_policy_.get_raw();
  // If there was a policy (e.g., in Reset()), make sure flags were preserved.
#define GOOGLE_DCHECK_POLICY_FLAGS_() \
  if (old_alloc_policy > 3)    \
    GOOGLE_CHECK_EQ(old_alloc_policy & 3, alloc_policy_.get_raw() & 3)
#else
#define GOOGLE_DCHECK_POLICY_FLAGS_()
#endif  // NDEBUG

  if (policy.IsDefault()) {
    // Legacy code doesn't use the API above, but provides the initial block
    // through ArenaOptions. I suspect most do not touch the allocation
    // policy parameters.
    InitializeFrom(mem, size);
    GOOGLE_DCHECK_POLICY_FLAGS_();
    return;
  }
  GOOGLE_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) & 7, 0u);
  Init();

  // Ignore initial block if it is too small. We include an optional
  // AllocationPolicy in this check, so that this can be allocated on the
  // first block.
  constexpr size_t kAPSize = internal::AlignUpTo8(sizeof(AllocationPolicy));
  constexpr size_t kMinimumSize = kBlockHeaderSize + kSerialArenaSize + kAPSize;

  // The value for alloc_policy_ stores whether or not allocations should be
  // recorded.
  alloc_policy_.set_should_record_allocs(
      policy.metrics_collector != nullptr &&
      policy.metrics_collector->RecordAllocs());
  // Make sure we have an initial block to store the AllocationPolicy.
  if (mem != nullptr && size >= kMinimumSize) {
    alloc_policy_.set_is_user_owned_initial_block(true);
  } else {
    auto tmp = AllocateMemory(&policy, 0, kMinimumSize);
    mem = tmp.ptr;
    size = tmp.size;
  }
  SetInitialBlock(mem, size);

  auto sa = threads_.load(std::memory_order_relaxed);
  // We ensured enough space so this cannot fail.
  void* p;
  if (!sa || !sa->MaybeAllocateAligned(kAPSize, &p)) {
    GOOGLE_LOG(FATAL) << "MaybeAllocateAligned cannot fail here.";
    return;
  }
  new (p) AllocationPolicy{policy};
  // Low bits store flags, so they mustn't be overwritten.
  GOOGLE_DCHECK_EQ(0, reinterpret_cast<uintptr_t>(p) & 3);
  alloc_policy_.set_policy(reinterpret_cast<AllocationPolicy*>(p));
  GOOGLE_DCHECK_POLICY_FLAGS_();

#undef GOOGLE_DCHECK_POLICY_FLAGS_
}